

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_definition.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnDefinition::ColumnDefinition
          (ColumnDefinition *this,string *name_p,LogicalType *type_p,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expression,TableColumnType category)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  LogicalType LStack_48;
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name_p->_M_dataplus)._M_p;
  paVar2 = &name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = name_p->_M_string_length;
  (name_p->_M_dataplus)._M_p = (pointer)paVar2;
  name_p->_M_string_length = 0;
  (name_p->field_2)._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&this->type,type_p);
  this->compression_type = COMPRESSION_AUTO;
  *(undefined4 *)&this->storage_oid = 0xffffffff;
  *(undefined4 *)((long)&this->storage_oid + 4) = 0xffffffff;
  *(undefined4 *)&this->oid = 0xffffffff;
  *(undefined4 *)((long)&this->oid + 4) = 0xffffffff;
  this->category = category;
  (this->expression).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (expression->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (expression->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  LogicalType::LogicalType(&LStack_48,SQLNULL);
  Value::Value(&this->comment,&LStack_48);
  LogicalType::~LogicalType(&LStack_48);
  (this->tags)._M_h._M_buckets = &(this->tags)._M_h._M_single_bucket;
  (this->tags)._M_h._M_bucket_count = 1;
  (this->tags)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->tags)._M_h._M_element_count = 0;
  (this->tags)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->tags)._M_h._M_rehash_policy._M_next_resize = (undefined1  [16])0x0;
  return;
}

Assistant:

ColumnDefinition::ColumnDefinition(string name_p, LogicalType type_p, unique_ptr<ParsedExpression> expression,
                                   TableColumnType category)
    : name(std::move(name_p)), type(std::move(type_p)), category(category), expression(std::move(expression)) {
}